

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int __thiscall
json::String::clone(String *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  pointer pcVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x28);
  *puVar2 = &PTR_clone_00128c60;
  puVar2[1] = puVar2 + 3;
  pcVar1 = (this->value)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar2 + 1),pcVar1,pcVar1 + (this->value)._M_string_length);
  return (int)puVar2;
}

Assistant:

virtual Type* clone() const {
            return new String(*this);
        }